

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_nreverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDX;
  bool bVar2;
  sexp tmp;
  sexp b;
  sexp a;
  sexp in_stack_ffffffffffffffc8;
  sexp_uint_t in_stack_ffffffffffffffd0;
  sexp psVar3;
  sexp local_8;
  
  local_8 = in_RCX;
  if (in_RCX != (sexp)&DAT_0000023e) {
    if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 6)) {
      psVar3 = (in_RCX->value).type.cpl;
      (in_RCX->value).string.offset = 0x23e;
      while( true ) {
        bVar2 = false;
        if (((ulong)psVar3 & 3) == 0) {
          bVar2 = psVar3->tag == 6;
        }
        if (!bVar2) break;
        psVar1 = (psVar3->value).type.cpl;
        (psVar3->value).type.cpl = local_8;
        local_8 = psVar3;
        psVar3 = psVar1;
      }
    }
    else {
      local_8 = sexp_type_exception(in_RDX,in_RCX,in_stack_ffffffffffffffd0,
                                    in_stack_ffffffffffffffc8);
    }
  }
  return local_8;
}

Assistant:

sexp sexp_nreverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp a, b, tmp;
  if (ls == SEXP_NULL) return ls;
  sexp_assert_type(ctx, sexp_pairp, SEXP_PAIR, ls);
  b = ls;
  a = sexp_cdr(ls);
  sexp_cdr(b) = SEXP_NULL;
  for ( ; sexp_pairp(a); b=a, a=tmp) {
    tmp = sexp_cdr(a);
    sexp_cdr(a) = b;
  }
  return b;
}